

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

Token * __thiscall FileTokenizer::loadToken(Token *__return_storage_ptr__,FileTokenizer *this)

{
  string *line;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  Token *source;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  bool bVar11;
  char32_t cVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  char cVar20;
  _Alloc_hider _Var21;
  ulong uVar22;
  ulong uVar23;
  string text;
  double value_1;
  string local_90;
  Token *local_70;
  uint local_64;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string local_58;
  ulong local_38;
  ulong uVar16;
  
  uVar23 = this->linePos;
  if ((this->currentLine)._M_string_length <= uVar23) {
    bVar10 = TextFile::atEnd(this->input);
    if (bVar10) {
      createToken(this,Invalid,0);
      goto LAB_0014cb61;
    }
    uVar23 = this->linePos;
  }
  if (this->equActive == true) {
    uVar15 = (this->currentLine)._M_string_length;
    uVar22 = uVar23;
    if (uVar23 < uVar15) {
      pcVar3 = (this->currentLine)._M_dataplus._M_p;
      uVar17 = uVar23;
      while (cVar2 = pcVar3[uVar17], uVar22 = uVar17, cVar2 != ';') {
        uVar16 = uVar17 + 1;
        if (((cVar2 == '/' && uVar16 < uVar15) && (pcVar3[uVar17 + 1] == '/')) ||
           (uVar22 = uVar15, uVar17 = uVar16, uVar15 == uVar16)) break;
      }
    }
    createTokenCurrentString(this,EquValue,uVar22 - uVar23);
    this->equActive = false;
LAB_0014cb61:
    *(undefined8 *)((long)&__return_storage_ptr__->column + 5) =
         *(undefined8 *)((long)&(this->token).column + 5);
    sVar18 = (this->token).column;
    __return_storage_ptr__->line = (this->token).line;
    __return_storage_ptr__->column = sVar18;
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::_Move_ctor_base
              ((_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &__return_storage_ptr__->value,
               (_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &(this->token).value);
    paVar1 = &(__return_storage_ptr__->originalText).field_2;
    (__return_storage_ptr__->originalText)._M_dataplus._M_p = (pointer)paVar1;
    pcVar3 = (this->token).originalText._M_dataplus._M_p;
    paVar9 = &(this->token).originalText.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar9) {
      uVar4 = *(undefined8 *)((long)&(this->token).originalText.field_2 + 8);
      paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->originalText).field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->originalText)._M_dataplus._M_p = pcVar3;
      (__return_storage_ptr__->originalText).field_2._M_allocated_capacity =
           paVar9->_M_allocated_capacity;
    }
    (__return_storage_ptr__->originalText)._M_string_length =
         (this->token).originalText._M_string_length;
    (this->token).originalText._M_dataplus._M_p = (pointer)paVar9;
    (this->token).originalText._M_string_length = 0;
    (this->token).originalText.field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  bVar10 = parseOperator(this);
  if (bVar10) goto LAB_0014cb61;
  line = &this->currentLine;
  source = (Token *)(this->currentLine)._M_dataplus._M_p;
  cVar2 = *(char *)((long)&((_Alloc_hider *)&source->line)->_M_p + uVar23);
  local_70 = source;
  if (cVar2 == '\"') {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    uVar23 = uVar23 + 1;
    uVar15 = (this->currentLine)._M_string_length;
    if (uVar23 < uVar15) {
      uVar22 = uVar23;
      do {
        uVar23 = uVar22 + 1;
        pcVar3 = (line->_M_dataplus)._M_p;
        cVar2 = pcVar3[uVar22];
        cVar20 = (char)&local_90;
        if (cVar2 == '\\' && uVar23 < uVar15) {
          cVar2 = pcVar3[uVar23];
          if (cVar2 == '\\') {
            std::__cxx11::string::push_back(cVar20);
          }
          else {
            if (cVar2 != '\"') goto LAB_0014cccd;
            std::__cxx11::string::push_back(cVar20);
          }
          uVar23 = uVar22 + 2;
        }
        else {
          if (cVar2 == '\"') {
            createToken(this,String,uVar23 - this->linePos,&local_90,0,local_90._M_string_length);
            Token::Token(__return_storage_ptr__,&this->token);
            goto LAB_0014cfce;
          }
LAB_0014cccd:
          std::__cxx11::string::push_back(cVar20);
        }
        uVar15 = (this->currentLine)._M_string_length;
        uVar22 = uVar23;
      } while (uVar23 < uVar15);
    }
    sVar18 = this->linePos;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Unexpected end of line in string constant","");
    createToken(this,Invalid,uVar23 - sVar18,&local_58,0,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    *(undefined8 *)((long)&__return_storage_ptr__->column + 5) =
         *(undefined8 *)((long)&(this->token).column + 5);
    sVar18 = (this->token).column;
    __return_storage_ptr__->line = (this->token).line;
    __return_storage_ptr__->column = sVar18;
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::_Move_ctor_base
              ((_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &__return_storage_ptr__->value,
               (_Move_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
               &(this->token).value);
    paVar1 = &(__return_storage_ptr__->originalText).field_2;
    (__return_storage_ptr__->originalText)._M_dataplus._M_p = (pointer)paVar1;
    pcVar3 = (this->token).originalText._M_dataplus._M_p;
    paVar9 = &(this->token).originalText.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar9) {
      uVar4 = *(undefined8 *)((long)&(this->token).originalText.field_2 + 8);
      paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->originalText).field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->originalText)._M_dataplus._M_p = pcVar3;
      (__return_storage_ptr__->originalText).field_2._M_allocated_capacity =
           paVar9->_M_allocated_capacity;
    }
    (__return_storage_ptr__->originalText)._M_string_length =
         (this->token).originalText._M_string_length;
    (this->token).originalText._M_dataplus._M_p = (pointer)paVar9;
    (this->token).originalText._M_string_length = 0;
    (this->token).originalText.field_2._M_local_buf[0] = '\0';
LAB_0014cfce:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0014d37e;
  }
  if (cVar2 == '\'') {
    local_90._M_dataplus._M_p = (pointer)(uVar23 + 1);
    cVar12 = anon_unknown.dwarf_18885a::decodeUtf8Character((string *)source,(size_t *)&local_90);
    if (local_90._M_dataplus._M_p[(long)source] == '\'') {
      createToken(this,Integer,(size_t)(local_90._M_dataplus._M_p + (1 - uVar23)),
                  (ulong)(uint)cVar12);
      goto LAB_0014cb61;
    }
  }
  else if ((byte)(cVar2 - 0x30U) < 10) {
    uVar15 = uVar23 + 1;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->currentLine)._M_string_length;
    if (cVar2 == '0' && uVar15 < local_60) {
      iVar13 = tolower((int)*(char *)((long)&((_Alloc_hider *)&source->line)->_M_p + uVar15));
      bVar10 = iVar13 == 0x78;
    }
    else {
      bVar10 = false;
    }
    uVar22 = uVar23;
    if (uVar23 < local_60) {
      bVar11 = true;
      bVar6 = false;
      bVar5 = false;
      local_64 = 0;
      do {
        cVar2 = *(char *)((long)&((_Alloc_hider *)&local_70->line)->_M_p + uVar22);
        iVar13 = isalnum((int)cVar2);
        if (iVar13 == 0) {
          if (cVar2 != '.') break;
LAB_0014d06f:
          if ((bVar5) || (bVar6)) {
            bVar6 = true;
            bVar11 = false;
          }
          else {
            bVar6 = true;
          }
        }
        else {
          if (cVar2 == '.') goto LAB_0014d06f;
          iVar13 = tolower((int)cVar2);
          if (iVar13 == 0x65) {
            if (!bVar10) {
              if (bVar5) {
                bVar11 = false;
              }
              else {
                uVar17 = uVar22 + 1;
                if (uVar17 < local_60) {
                  cVar2 = *(char *)((long)&((_Alloc_hider *)&local_70->line)->_M_p + uVar17);
                  uVar16 = 0;
                  if ((cVar2 == '-') || (cVar2 == '+')) {
                    if (uVar22 + 2 < local_60) {
                      uVar14 = isalnum((int)*(char *)((long)&((_Alloc_hider *)&local_70->line)->_M_p
                                                     + uVar22 + 2));
                      uVar16 = (ulong)uVar14;
                      uVar15 = CONCAT71((int7)(uVar15 >> 8),1);
                      local_64 = (uint)uVar15;
                      if (uVar14 == 0) goto LAB_0014d0f2;
                    }
                    else {
LAB_0014d0f2:
                      local_64 = (uint)CONCAT71((int7)(uVar16 >> 8),1);
                      bVar11 = false;
                    }
                    bVar5 = true;
                    uVar22 = uVar17;
                    goto LAB_0014d111;
                  }
                }
              }
              bVar5 = true;
            }
          }
          else if ((iVar13 == 0x68) && (uVar15 = 0, (local_64 & 1) == 0)) {
            bVar10 = true;
          }
        }
LAB_0014d111:
        uVar22 = uVar22 + 1;
      } while (uVar22 < local_60);
      if ((!bVar6) && (!(bool)(bVar5 & (bVar10 ^ 1U)))) goto LAB_0014d13b;
      if (!bVar11) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Invalid floating point number","");
        createToken(this,Invalid,uVar22 - uVar23,&local_90,0,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0014d1fb;
      }
      bVar10 = convertFloat(this,uVar23,uVar22,(double *)&local_58);
      sVar18 = uVar22 - uVar23;
      if (bVar10) {
        createToken(this,Float,sVar18,(double)local_58._M_dataplus._M_p);
        goto LAB_0014d1fb;
      }
    }
    else {
LAB_0014d13b:
      bVar10 = stringToInt(line,uVar23,uVar22,(int64_t *)&local_90);
      sVar18 = uVar22 - uVar23;
      if (bVar10) {
        createToken(this,Integer,sVar18,(int64_t)local_90._M_dataplus._M_p);
        goto LAB_0014d1fb;
      }
    }
    createTokenCurrentString(this,NumberString,sVar18);
LAB_0014d1fb:
    Token::Token(__return_storage_ptr__,&this->token);
    return __return_storage_ptr__;
  }
  if (uVar23 < (this->currentLine)._M_string_length) {
    bVar10 = true;
    do {
      bVar10 = SymbolTable::isValidSymbolCharacter((line->_M_dataplus)._M_p[uVar23],bVar10);
      if (!bVar10) break;
      uVar23 = uVar23 + 1;
      bVar10 = false;
    } while (uVar23 < (this->currentLine)._M_string_length);
  }
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (uVar23 - this->linePos);
  local_38 = uVar23;
  if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    cVar12 = anon_unknown.dwarf_18885a::decodeUtf8Character
                       ((string *)(line->_M_dataplus)._M_p,&local_38);
    convertUnicodeCharToUtf8_abi_cxx11_(&local_58,cVar12);
    tinyformat::format<std::__cxx11::string>
              (&local_90,(tinyformat *)"Invalid input \'%s\'",(char *)&local_58,args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    createToken(this,Invalid,local_38 - uVar23,&local_90,0,local_90._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)line);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_90._M_dataplus._M_p + local_90._M_string_length);
    _Var21._M_p = local_90._M_dataplus._M_p;
    if (0 < (long)local_90._M_string_length >> 2) {
      lVar19 = ((long)local_90._M_string_length >> 2) + 1;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_90._M_dataplus._M_p + 3);
      do {
        _Var21._M_p = (pointer)paVar9;
        iVar13 = iswupper((int)_Var21._M_p[-3]);
        if (iVar13 != 0) {
          _Var21._M_p = (pointer)(_Var21._M_p + -3);
          goto LAB_0014d278;
        }
        iVar13 = iswupper((int)_Var21._M_p[-2]);
        if (iVar13 != 0) {
          _Var21._M_p = (pointer)(_Var21._M_p + -2);
          goto LAB_0014d278;
        }
        iVar13 = iswupper((int)_Var21._M_p[-1]);
        if (iVar13 != 0) {
          _Var21._M_p = (pointer)(_Var21._M_p + -1);
          goto LAB_0014d278;
        }
        iVar13 = iswupper((int)*_Var21._M_p);
        if (iVar13 != 0) goto LAB_0014d278;
        lVar19 = lVar19 + -1;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(_Var21._M_p + 4);
      } while (1 < lVar19);
      _Var21._M_p = _Var21._M_p + 1;
    }
    lVar19 = (long)paVar1 - (long)_Var21._M_p;
    if (lVar19 == 1) {
LAB_0014cf8e:
      iVar13 = iswupper((int)*_Var21._M_p);
      if (iVar13 == 0) {
        _Var21._M_p = (pointer)paVar1;
      }
LAB_0014d278:
      sVar8 = local_90._M_string_length;
      _Var7._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var21._M_p == paVar1) goto LAB_0014d2d3;
      if (local_90._M_string_length == 0) {
        iVar13 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar13 != 0) {
LAB_0014d316:
          createToken(this,Identifier,uVar23 - this->linePos,&local_90,0,local_90._M_string_length);
          goto LAB_0014d35a;
        }
        goto LAB_0014d33b;
      }
      sVar18 = 0;
      local_70 = __return_storage_ptr__;
      local_60 = paVar1;
      do {
        iVar13 = tolower((int)_Var7._M_p[sVar18]);
        _Var7._M_p[sVar18] = (char)iVar13;
        sVar18 = sVar18 + 1;
      } while (sVar8 != sVar18);
      iVar13 = std::__cxx11::string::compare((char *)&local_90);
      __return_storage_ptr__ = local_70;
      if (iVar13 == 0) goto LAB_0014d33b;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var21._M_p != local_60) goto LAB_0014d316;
    }
    else {
      if (lVar19 == 2) {
LAB_0014cf79:
        iVar13 = iswupper((int)*_Var21._M_p);
        if (iVar13 == 0) {
          _Var21._M_p = _Var21._M_p + 1;
          goto LAB_0014cf8e;
        }
        goto LAB_0014d278;
      }
      if (lVar19 == 3) {
        iVar13 = iswupper((int)*_Var21._M_p);
        if (iVar13 == 0) {
          _Var21._M_p = _Var21._M_p + 1;
          goto LAB_0014cf79;
        }
        goto LAB_0014d278;
      }
LAB_0014d2d3:
      iVar13 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar13 == 0) {
LAB_0014d33b:
        createToken(this,Equ,uVar23 - this->linePos);
        this->equActive = true;
        goto LAB_0014d35a;
      }
    }
    createTokenCurrentString(this,Identifier,uVar23 - this->linePos);
  }
LAB_0014d35a:
  Token::Token(__return_storage_ptr__,&this->token);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    return __return_storage_ptr__;
  }
LAB_0014d37e:
  operator_delete(local_90._M_dataplus._M_p,
                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                           local_90.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

Token FileTokenizer::loadToken()
{
	if (isInputAtEnd())
	{
		createToken(TokenType::Invalid,0);
		return std::move(token);
	}

	size_t pos = linePos;

	if (equActive)
	{
		while (pos < currentLine.size() && !isComment(currentLine,pos))
			pos++;

		createTokenCurrentString(TokenType::EquValue,pos-linePos);

		equActive = false;
		return std::move(token);
	}

	if (parseOperator())
		return std::move(token);

	char first = currentLine[pos];

	// character constants
	if (first == '\'')
	{
		size_t decodePos = pos+1;

		auto value = int64_t(decodeUtf8Character(currentLine, decodePos));
		if (currentLine[decodePos] == '\'')
		{
			createToken(TokenType::Integer,decodePos+1-pos,value);
			return std::move(token);
		}
	}

	// strings
	if (first == '"')
	{
		std::string text;
		pos++;

		bool valid = false;
		while (pos < currentLine.size())
		{
			if (pos+1 < currentLine.size() && currentLine[pos] == '\\')
			{
				if (currentLine[pos+1] == '"')
				{
					text += '"';
					pos += 2;
					continue;
				}
				
				if (currentLine[pos+1] == '\\')
				{
					text += '\\';
					pos += 2;
					continue;
				}
			}

			if (currentLine[pos] == '"')
			{
				pos++;
				valid = true;
				break;
			}

			text += currentLine[pos++];
		}

		if (!valid)
		{
			createToken(TokenType::Invalid,pos-linePos, "Unexpected end of line in string constant");
			return std::move(token);
		}
		
		createToken(TokenType::String,pos-linePos,text);
		return std::move(token);
	}

	// numbers
	if (first >= '0' && first <= '9')
	{
		// find end of number
		size_t start = pos;
		size_t end = pos;
		bool isValid = true;
		bool foundPoint = false;
		bool foundExp = false;
		bool foundExpSign = false;
		bool isHex = start+1 < currentLine.size() && currentLine[start] == '0' && tolower(currentLine[start+1]) == 'x';

		while (end < currentLine.size() && (isalnum(currentLine[end]) || currentLine[end] == '.'))
		{
			if (currentLine[end] == '.')
			{
				if (foundExp || foundPoint)
					isValid = false;
				foundPoint = true;
			} else if (tolower(currentLine[end]) == 'h' && !foundExpSign) {
				isHex = true;
			} else if (tolower(currentLine[end]) == 'e' && !isHex)
			{
				if (foundExp)
				{
					isValid = false;
				} else if (end+1 < currentLine.size() && (currentLine[end+1] == '+' || currentLine[end+1] == '-')){
					end++;
					if (end+1 >= currentLine.size() || !isalnum(currentLine[end+1]))
						isValid = false;
					foundExpSign = true;
				}
				foundExp = true;
			}

			end++;
		}

		bool isFloat = foundPoint || (foundExp && !isHex);

		if (!isFloat)
		{
			int64_t value;
			if (!convertInteger(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Integer,end-start,value);
		} else { // isFloat
			double value;
			if (!isValid)
			{
				createToken(TokenType::Invalid,end-start, "Invalid floating point number");
				return std::move(token);
			}

			if (!convertFloat(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Float,end-start,value);
		}
		
		return std::move(token);
	}

	// identifiers
	bool isFirst = true;
	while (pos < currentLine.size() && Global.symbolTable.isValidSymbolCharacter(currentLine[pos],isFirst))
	{
		pos++;
		isFirst = false;
	}

	if (pos == linePos)
	{
		auto characterStart = pos;
		auto value = decodeUtf8Character(currentLine, pos);
		std::string text = tfm::format("Invalid input '%s'",convertUnicodeCharToUtf8(value));
		createToken(TokenType::Invalid,pos-characterStart,text);
		return std::move(token);
	}

	std::string text = currentLine.substr(linePos,pos-linePos);
	bool textLowered = false;
	// Lowercase is common, let's try to avoid a copy.
	if (std::any_of(text.begin(), text.end(), ::iswupper))
	{
		std::transform(text.begin(), text.end(), text.begin(), ::tolower);
		textLowered = true;
	}

	if (text == "equ")
	{
		createToken(TokenType::Equ,pos-linePos);
		equActive = true;
	} else if (textLowered) {
		createToken(TokenType::Identifier,pos-linePos,text);
	} else {
		createTokenCurrentString(TokenType::Identifier,pos-linePos);
	}

	return std::move(token);
}